

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoadStoreLane
          (PrintExpressionContents *this,SIMDLoadStoreLane *curr)

{
  ulong uVar1;
  Index IVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  Module *in_R8;
  Name name;
  
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[35m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  switch(curr->op) {
  case Load8LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load8_lane";
    lVar3 = 0xf;
    goto LAB_00a4097e;
  case Load16LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load16_lane";
    break;
  case Load32LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load32_lane";
    break;
  case Load64LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load64_lane";
    break;
  case Store8LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.store8_lane";
    break;
  case Store16LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.store16_lane";
    goto LAB_00a40979;
  case Store32LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.store32_lane";
    goto LAB_00a40979;
  case Store64LaneVec128:
    poVar5 = this->o;
    pcVar4 = "v128.store64_lane";
LAB_00a40979:
    lVar3 = 0x11;
    goto LAB_00a4097e;
  default:
    goto switchD_00a40907_default;
  }
  lVar3 = 0x10;
LAB_00a4097e:
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
switchD_00a40907_default:
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  uVar1 = (curr->align).addr;
  IVar2 = SIMDLoadStoreLane::getMemBytes(curr);
  if (uVar1 != IVar2) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," align=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  poVar5 = this->o;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ostream::operator<<(poVar5,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8LaneVec128:
        o << "v128.load8_lane";
        break;
      case Load16LaneVec128:
        o << "v128.load16_lane";
        break;
      case Load32LaneVec128:
        o << "v128.load32_lane";
        break;
      case Load64LaneVec128:
        o << "v128.load64_lane";
        break;
      case Store8LaneVec128:
        o << "v128.store8_lane";
        break;
      case Store16LaneVec128:
        o << "v128.store16_lane";
        break;
      case Store32LaneVec128:
        o << "v128.store32_lane";
        break;
      case Store64LaneVec128:
        o << "v128.store64_lane";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
    o << " " << int(curr->index);
  }